

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O3

void Gia_ManHashResize(Gia_Man_t *p)

{
  Vec_Int_t *pVVar1;
  int *__ptr;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  int *piVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar12;
  
  lVar5 = (long)(p->vHTable).nSize;
  if (lVar5 < 1) {
    __assert_fail("Vec_IntSize(&vOld) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                  ,0xaa,"void Gia_ManHashResize(Gia_Man_t *)");
  }
  pVVar1 = &p->vHTable;
  __ptr = (p->vHTable).pArray;
  pVVar1->nCap = 0;
  pVVar1->nSize = 0;
  (p->vHTable).pArray = (int *)0x0;
  uVar15 = (ulong)((~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) * 2 - 1);
  while( true ) {
    do {
      uVar8 = (uint)uVar15;
      uVar11 = uVar8 + 1;
      uVar12 = (ulong)uVar11;
      uVar3 = uVar15 & 1;
      uVar15 = uVar12;
    } while (uVar3 != 0);
    if (uVar11 < 9) break;
    iVar13 = 5;
    while (uVar11 % (iVar13 - 2U) != 0) {
      uVar4 = iVar13 * iVar13;
      iVar13 = iVar13 + 2;
      if (uVar11 < uVar4) {
        if (uVar8 < 0x7fffffff) goto LAB_00209877;
        goto LAB_002098a7;
      }
    }
  }
LAB_00209877:
  piVar6 = (int *)malloc(uVar12 * 4);
  (p->vHTable).pArray = piVar6;
  if (piVar6 == (int *)0x0) {
    __assert_fail("p->pArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
  }
  pVVar1->nCap = uVar11;
  memset(piVar6,0,uVar12 << 2);
LAB_002098a7:
  (p->vHTable).nSize = uVar11;
  lVar16 = 0;
  iVar13 = 0;
  while( true ) {
    iVar10 = __ptr[lVar16];
    uVar15 = (ulong)iVar10;
    if (((long)uVar15 < 0) || (uVar8 = (p->vHash).nSize, (int)uVar8 <= iVar10)) break;
    if (iVar10 != 0) {
      piVar6 = (p->vHash).pArray;
      puVar7 = (uint *)(piVar6 + uVar15);
      do {
        uVar11 = (uint)uVar15;
        if (p->nObjs <= (int)uVar11) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (uVar8 <= uVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar4 = *puVar7;
        uVar15 = uVar15 & 0xffffffff;
        pGVar2 = p->pObjs;
        piVar6[uVar15] = 0;
        uVar3 = *(ulong *)(pGVar2 + uVar15);
        iVar10 = uVar11 - ((uint)uVar3 & 0x1fffffff);
        if ((iVar10 < 0) ||
           (uVar8 = (uint)(uVar3 >> 0x20), iVar14 = uVar11 - (uVar8 & 0x1fffffff), iVar14 < 0)) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        if (p->pMuxes == (uint *)0x0) {
          uVar9 = 0xffffffff;
        }
        else {
          if (p->nObjs <= (int)uVar11) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar9 = p->pMuxes[uVar15];
          uVar9 = -(uint)(uVar9 == 0) | uVar9;
        }
        puVar7 = (uint *)Gia_ManHashFind(p,((uint)(uVar3 >> 0x1d) & 1) + iVar10 * 2,
                                         (uVar8 >> 0x1d & 1) + iVar14 * 2,uVar9);
        if (*puVar7 != 0) {
          __assert_fail("*pPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                        ,0xb8,"void Gia_ManHashResize(Gia_Man_t *)");
        }
        *puVar7 = uVar11;
        if (((int)uVar4 < 0) || (uVar8 = (p->vHash).nSize, (int)uVar8 <= (int)uVar4))
        goto LAB_00209a03;
        piVar6 = (p->vHash).pArray;
        puVar7 = (uint *)(piVar6 + uVar4);
        iVar13 = iVar13 + 1;
        uVar15 = (ulong)uVar4;
      } while ((ulong)uVar4 != 0);
    }
    lVar16 = lVar16 + 1;
    if (lVar16 == lVar5) {
      if (iVar13 != (~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) - p->nBufs) {
        __assert_fail("Counter == Counter2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                      ,0xbe,"void Gia_ManHashResize(Gia_Man_t *)");
      }
      if (__ptr != (int *)0x0) {
        free(__ptr);
        return;
      }
      return;
    }
  }
LAB_00209a03:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManHashResize( Gia_Man_t * p )
{
    int i, iThis, iNext, Counter, Counter2, * pPlace;
    Vec_Int_t vOld = p->vHTable;
    assert( Vec_IntSize(&vOld) > 0 );
    // replace the table
    Vec_IntZero( &p->vHTable );
    Vec_IntFill( &p->vHTable, Abc_PrimeCudd( 2 * Gia_ManAndNum(p) ), 0 ); 
    // rehash the entries from the old table
    Counter = 0;
    Vec_IntForEachEntry( &vOld, iThis, i )
        for ( iNext = Vec_IntEntry(&p->vHash, iThis);  
              iThis;  iThis = iNext,   
              iNext = Vec_IntEntry(&p->vHash, iThis)  )
        {
            Gia_Obj_t * pThis0 = Gia_ManObj( p, iThis );
            Vec_IntWriteEntry( &p->vHash, iThis, 0 );
            pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0(pThis0, iThis), Gia_ObjFaninLit1(pThis0, iThis), Gia_ObjFaninLit2p(p, pThis0) );
            assert( *pPlace == 0 ); // should not be there
            *pPlace = iThis;
            assert( *pPlace != 0 );
            Counter++;
        }
    Counter2 = Gia_ManAndNum(p) - Gia_ManBufNum(p);
    assert( Counter == Counter2 );
//    if ( p->fVerbose )
//        printf( "Resizing GIA hash table: %d -> %d.\n", Vec_IntSize(&vOld), Vec_IntSize(&p->vHTable) );
    Vec_IntErase( &vOld );
}